

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeLZ77data(size_t *bp,ucvector *out,uivector *lz77_encoded,HuffmanTree *tree_ll,
                  HuffmanTree *tree_d)

{
  uint value;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint distance_extra_bits;
  uint n_distance_extra_bits;
  uint distance_index;
  uint distance_code;
  uint length_extra_bits;
  uint n_length_extra_bits;
  uint length_index;
  uint val;
  size_t i;
  HuffmanTree *tree_d_local;
  HuffmanTree *tree_ll_local;
  uivector *lz77_encoded_local;
  ucvector *out_local;
  size_t *bp_local;
  
  for (_length_index = 0; _length_index != lz77_encoded->size; _length_index = _length_index + 1) {
    uVar3 = lz77_encoded->data[_length_index];
    uVar1 = HuffmanTree_getCode(tree_ll,uVar3);
    uVar2 = HuffmanTree_getLength(tree_ll,uVar3);
    addHuffmanSymbol(bp,out,uVar1,uVar2);
    if (0x100 < uVar3) {
      uVar1 = lz77_encoded->data[_length_index + 2];
      uVar2 = DISTANCEEXTRA[uVar1];
      value = lz77_encoded->data[_length_index + 3];
      addBitsToStream(bp,out,lz77_encoded->data[_length_index + 1],(ulong)LENGTHEXTRA[uVar3 - 0x101]
                     );
      uVar3 = HuffmanTree_getCode(tree_d,uVar1);
      uVar1 = HuffmanTree_getLength(tree_d,uVar1);
      addHuffmanSymbol(bp,out,uVar3,uVar1);
      addBitsToStream(bp,out,value,(ulong)uVar2);
      _length_index = _length_index + 3;
    }
  }
  return;
}

Assistant:

static void writeLZ77data(size_t* bp, ucvector* out, const uivector* lz77_encoded,
                          const HuffmanTree* tree_ll, const HuffmanTree* tree_d)
{
  size_t i = 0;
  for(i = 0; i != lz77_encoded->size; ++i)
  {
    unsigned val = lz77_encoded->data[i];
    addHuffmanSymbol(bp, out, HuffmanTree_getCode(tree_ll, val), HuffmanTree_getLength(tree_ll, val));
    if(val > 256) /*for a length code, 3 more things have to be added*/
    {
      unsigned length_index = val - FIRST_LENGTH_CODE_INDEX;
      unsigned n_length_extra_bits = LENGTHEXTRA[length_index];
      unsigned length_extra_bits = lz77_encoded->data[++i];

      unsigned distance_code = lz77_encoded->data[++i];

      unsigned distance_index = distance_code;
      unsigned n_distance_extra_bits = DISTANCEEXTRA[distance_index];
      unsigned distance_extra_bits = lz77_encoded->data[++i];

      addBitsToStream(bp, out, length_extra_bits, n_length_extra_bits);
      addHuffmanSymbol(bp, out, HuffmanTree_getCode(tree_d, distance_code),
                       HuffmanTree_getLength(tree_d, distance_code));
      addBitsToStream(bp, out, distance_extra_bits, n_distance_extra_bits);
    }
  }
}